

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O2

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  MessageType t;
  string message;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == __lhs) {
    std::__cxx11::string::string
              ((string *)&message,"called with incorrect number of arguments",(allocator *)&local_60
              );
    cmCommand::SetError(&this->super_cmCommand,&message);
  }
  else {
    bVar3 = std::operator==(__lhs,"SEND_ERROR");
    if (bVar3) {
      t = FATAL_ERROR;
      goto LAB_002a5faa;
    }
    bVar3 = std::operator==(__lhs,"FATAL_ERROR");
    if (bVar3) {
      bVar3 = true;
      t = FATAL_ERROR;
LAB_002a5ff3:
      local_60.Begin._M_current = __lhs + 1;
      bVar4 = false;
    }
    else {
      bVar3 = std::operator==(__lhs,"WARNING");
      if (bVar3) {
        t = WARNING;
LAB_002a5faa:
        bVar4 = false;
        local_60.Begin._M_current = __lhs + 1;
      }
      else {
        bVar3 = std::operator==(__lhs,"AUTHOR_WARNING");
        if (bVar3) {
          t = AUTHOR_WARNING;
          goto LAB_002a5faa;
        }
        bVar3 = std::operator==(__lhs,"STATUS");
        if (bVar3) {
          bVar4 = true;
          t = MESSAGE;
          local_60.Begin._M_current = __lhs + 1;
        }
        else {
          bVar3 = std::operator==(__lhs,"DEPRECATION");
          if (bVar3) {
            pcVar2 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string
                      ((string *)&message,"CMAKE_ERROR_DEPRECATED",(allocator *)&local_60);
            bVar3 = cmMakefile::IsOn(pcVar2,&message);
            std::__cxx11::string::~string((string *)&message);
            if (bVar3) {
              t = DEPRECATION_ERROR;
            }
            else {
              pcVar2 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string
                        ((string *)&message,"CMAKE_WARN_DEPRECATED",(allocator *)&local_60);
              bVar4 = cmMakefile::IsOn(pcVar2,&message);
              std::__cxx11::string::~string((string *)&message);
              if (!bVar4) goto LAB_002a60a6;
              t = DEPRECATION_WARNING;
            }
            goto LAB_002a5ff3;
          }
          t = MESSAGE;
          bVar4 = false;
          local_60.Begin._M_current = __lhs;
        }
      }
      bVar3 = false;
    }
    local_60.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = '\0';
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&message,&local_60,local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (t == MESSAGE) {
      if (bVar4) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,message._M_dataplus._M_p,-1.0);
      }
      else {
        cmSystemTools::Message(message._M_dataplus._M_p,(char *)0x0);
      }
    }
    else {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,t,&message);
    }
    if (bVar3 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
  }
  std::__cxx11::string::~string((string *)&message);
LAB_002a60a6:
  return pbVar1 != __lhs;
}

Assistant:

bool cmMessageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();

  cmake::MessageType type = cmake::MESSAGE;
  bool status = false;
  bool fatal = false;
  if (*i == "SEND_ERROR")
    {
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "FATAL_ERROR")
    {
    fatal = true;
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "WARNING")
    {
    type = cmake::WARNING;
    ++i;
    }
  else if (*i == "AUTHOR_WARNING")
    {
    type = cmake::AUTHOR_WARNING;
    ++i;
    }
  else if (*i == "STATUS")
    {
    status = true;
    ++i;
    }
  else if (*i == "DEPRECATION")
    {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED"))
      {
      fatal = true;
      type = cmake::DEPRECATION_ERROR;
      }
    else if (this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))
      {
      type = cmake::DEPRECATION_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }

  std::string message = cmJoin(cmRange(i, args.end()), std::string());

  if (type != cmake::MESSAGE)
    {
    this->Makefile->IssueMessage(type, message);
    }
  else
    {
    if (status)
      {
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    else
      {
      cmSystemTools::Message(message.c_str());
      }
    }
  if(fatal)
    {
    cmSystemTools::SetFatalErrorOccured();
    }
  return true;
}